

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int ssl_check_record_type(uint8_t record_type)

{
  undefined4 local_c;
  uint8_t record_type_local;
  
  if ((((record_type == '\x16') || (record_type == '\x15')) || (record_type == '\x14')) ||
     (record_type == '\x17')) {
    local_c = 0;
  }
  else {
    local_c = -0x7200;
  }
  return local_c;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_check_record_type(uint8_t record_type)
{
    if (record_type != MBEDTLS_SSL_MSG_HANDSHAKE &&
        record_type != MBEDTLS_SSL_MSG_ALERT &&
        record_type != MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC &&
        record_type != MBEDTLS_SSL_MSG_APPLICATION_DATA) {
        return MBEDTLS_ERR_SSL_INVALID_RECORD;
    }

    return 0;
}